

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O1

void __thiscall chipemu::implementation::nmos::stabilize_network(nmos *this)

{
  ushort *puVar1;
  uint16_t id;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  uint16_t *puVar6;
  pointer puVar7;
  ushort uVar8;
  
  if (this->desc_nodes_count != 0) {
    puVar2 = (this->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->node_offsets).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->changed_queue).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->changed_queue).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar7 = (this->changed_feeding)._M_current;
    uVar8 = 1;
    do {
      if ((puVar2[puVar3[uVar8]] & 8) == 0) {
        *puVar7 = uVar8;
        puVar7 = puVar7 + 1;
        if (puVar7 == puVar5) {
          puVar7 = puVar4;
        }
        (this->changed_feeding)._M_current = puVar7;
        puVar1 = puVar2 + puVar3[uVar8];
        *puVar1 = *puVar1 | 8;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 <= this->desc_nodes_count);
  }
  while (puVar6 = (this->changed_eating)._M_current, puVar6 != (this->changed_feeding)._M_current) {
    id = *puVar6;
    (this->changed_eating)._M_current = puVar6 + 1;
    if (puVar6 + 1 ==
        (this->changed_queue).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      (this->changed_eating)._M_current =
           (this->changed_queue).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    recalc_node(this,id);
  }
  return;
}

Assistant:

void
nmos::stabilize_network() noexcept
{
    for (uint16_t i = 1; i <= node_count(); ++i) {
        changed_push(i);
    }
    recalc_nodes();
}